

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O0

bool __thiscall
draco::AttributeOctahedronTransform::InverseTransformAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  byte bVar1;
  bool bVar2;
  DataType DVar3;
  size_t sVar4;
  PointAttribute *in_RDX;
  OctahedronToolBox *in_RSI;
  long in_RDI;
  int32_t t;
  int32_t s;
  uint32_t i;
  OctahedronToolBox octahedron_tool_box;
  uint8_t *target_address;
  int32_t *source_attribute_data;
  float att_val [3];
  int kEntrySize;
  int num_components;
  int num_points;
  int32_t in_stack_ffffffffffffff68;
  int32_t in_stack_ffffffffffffff6c;
  OctahedronToolBox *this_00;
  GeometryAttribute *in_stack_ffffffffffffff78;
  uint local_6c;
  OctahedronToolBox local_68;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_54;
  uint8_t *local_50;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_44;
  uint8_t *local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined4 local_2c;
  uint local_28;
  uint local_24;
  PointAttribute *local_20;
  OctahedronToolBox *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  DVar3 = GeometryAttribute::data_type(&in_RDX->super_GeometryAttribute);
  if (DVar3 == DT_FLOAT32) {
    sVar4 = PointAttribute::size(local_20);
    local_24 = (uint)sVar4;
    bVar1 = GeometryAttribute::num_components(&local_20->super_GeometryAttribute);
    local_28 = (uint)bVar1;
    if (local_28 == 3) {
      local_2c = 0xc;
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_44,0);
      local_40 = GeometryAttribute::GetAddress
                           (in_stack_ffffffffffffff78,
                            (AttributeValueIndex)(uint)((ulong)in_RDI >> 0x20));
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_54,0);
      local_50 = GeometryAttribute::GetAddress
                           (&local_20->super_GeometryAttribute,
                            (AttributeValueIndex)(uint)((ulong)in_RDI >> 0x20));
      OctahedronToolBox::OctahedronToolBox(&local_68);
      bVar2 = OctahedronToolBox::SetQuantizationBits(&local_68,*(int32_t *)(in_RDI + 8));
      if (bVar2) {
        this_00 = local_18;
        for (local_6c = 0; local_6c < local_24; local_6c = local_6c + 1) {
          local_40 = local_40 + 8;
          OctahedronToolBox::QuantizedOctahedralCoordsToUnitVector
                    (this_00,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,(float *)0x20c849);
          *(undefined8 *)local_50 = local_38;
          *(undefined4 *)(local_50 + 8) = local_30;
          local_50 = local_50 + 0xc;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool AttributeOctahedronTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  const int num_points = target_attribute->size();
  const int num_components = target_attribute->num_components();
  if (num_components != 3) {
    return false;
  }
  constexpr int kEntrySize = sizeof(float) * 3;
  float att_val[3];
  const int32_t *source_attribute_data = reinterpret_cast<const int32_t *>(
      attribute.GetAddress(AttributeValueIndex(0)));
  uint8_t *target_address =
      target_attribute->GetAddress(AttributeValueIndex(0));
  OctahedronToolBox octahedron_tool_box;
  if (!octahedron_tool_box.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  for (uint32_t i = 0; i < num_points; ++i) {
    const int32_t s = *source_attribute_data++;
    const int32_t t = *source_attribute_data++;
    octahedron_tool_box.QuantizedOctahedralCoordsToUnitVector(s, t, att_val);

    // Store the decoded floating point values into the attribute buffer.
    std::memcpy(target_address, att_val, kEntrySize);
    target_address += kEntrySize;
  }
  return true;
}